

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grid.cpp
# Opt level: O2

void __thiscall
Nova::Grid<float,_2>::Nodes_In_Cell_From_Minimum_Corner_Node
          (Grid<float,_2> *this,T_INDEX *minimum_corner_node,T_INDEX *nodes)

{
  Range_Iterator<2,_Nova::Vector<int,_2,_true>_> iterator;
  Range_Iterator<2,_Nova::Vector<int,_2,_true>_> RStack_58;
  Range<int,_2> local_38;
  
  local_38.min_corner._data._M_elems = (T_STORAGE)(_Type)0x0;
  local_38.max_corner._data._M_elems = (T_STORAGE)(_Type)0x100000001;
  Range_Iterator<2,Nova::Vector<int,2,true>>::Range_Iterator<Nova::Range<int,2>>
            ((Range_Iterator<2,Nova::Vector<int,2,true>> *)&RStack_58,&local_38);
  while (RStack_58.index._data._M_elems[0] * RStack_58.direction._data._M_elems[0] <=
         RStack_58.direction._data._M_elems[0] * RStack_58.max_corner._data._M_elems[0]) {
    Vector<int,_2,_true>::operator+(&local_38.min_corner,minimum_corner_node);
    *(T_STORAGE *)(nodes->_data)._M_elems = local_38.min_corner._data._M_elems;
    Range_Iterator<2,_Nova::Vector<int,_2,_true>_>::Next(&RStack_58);
    nodes = nodes + 1;
  }
  return;
}

Assistant:

void Grid<T,d>::
Nodes_In_Cell_From_Minimum_Corner_Node(const T_INDEX& minimum_corner_node,T_INDEX nodes[number_of_nodes_per_cell]) const
{
    int node=0;
    for(Range_Iterator<d> iterator(Range<int,d>(T_INDEX(),T_INDEX(1)));iterator.Valid();iterator.Next())
        nodes[node++]=minimum_corner_node+iterator.Index();
}